

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Psr_ManWriteBlifArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vFanins)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  int NameId;
  int i;
  Vec_Int_t *vFanins_local;
  Psr_Ntk_t *p_local;
  FILE *pFile_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vFanins), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vFanins,local_24);
    pcVar2 = Psr_NtkStr(p,iVar1);
    fprintf((FILE *)pFile," %s",pcVar2);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writing parser state into a file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Psr_ManWriteBlifArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vFanins )
{
    int i, NameId;
    Vec_IntForEachEntry( vFanins, NameId, i )
        fprintf( pFile, " %s", Psr_NtkStr(p, NameId) );
    fprintf( pFile, "\n" );
}